

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O0

TransformDerivative * __thiscall
iDynTree::RevoluteJoint::getTransformDerivative
          (RevoluteJoint *this,VectorDynSize *jntPos,LinkIndex linkA,LinkIndex linkB,int posCoord_i)

{
  ulong uVar1;
  long in_RCX;
  VectorDynSize *in_RDX;
  long *in_RSI;
  RevoluteJoint *in_RDI;
  TransformDerivative link1_dX_link2;
  double ang;
  TransformDerivative *linkA_dX_linkB;
  RevoluteJoint *this_00;
  TransformDerivative local_f8;
  TransformDerivative local_98;
  double local_38;
  long local_20;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  uVar1 = (**(code **)(*in_RSI + 0xb0))();
  local_38 = (double)iDynTree::VectorDynSize::operator()(in_RDX,uVar1);
  iDynTree::Axis::getRotationTransformDerivative(local_38);
  iDynTree::TransformDerivative::operator*(&local_98,(Transform *)&local_f8);
  TransformDerivative::~TransformDerivative(&local_f8);
  if (local_20 == in_RSI[4]) {
    iDynTree::TransformDerivative::TransformDerivative((TransformDerivative *)in_RDI,&local_98);
  }
  else {
    updateBuffers(this_00,(double)in_RDI);
    iDynTree::TransformDerivative::derivativeOfInverse((Transform *)in_RDI);
  }
  TransformDerivative::~TransformDerivative(&local_98);
  return (TransformDerivative *)this_00;
}

Assistant:

TransformDerivative RevoluteJoint::getTransformDerivative(const VectorDynSize& jntPos,
                                                          const LinkIndex linkA,
                                                          const LinkIndex linkB,
                                                          const int posCoord_i) const
{
    const double ang = jntPos(this->getPosCoordsOffset());

    TransformDerivative link1_dX_link2 = rotation_axis_wrt_link1.getRotationTransformDerivative(ang)*link1_X_link2_at_rest;

    if( linkA == this->link1 )
    {
        return link1_dX_link2;
    }
    else
    {
        updateBuffers(ang);
        TransformDerivative linkA_dX_linkB = link1_dX_link2.derivativeOfInverse(this->link1_X_link2);
        return linkA_dX_linkB;
    }
}